

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::copy_dynamic_state<VkGraphicsPipelineCreateInfo>
          (Impl *this,VkGraphicsPipelineCreateInfo *info,ScratchAllocator *alloc,
          DynamicStateInfo *param_3)

{
  VkPipelineDynamicStateCreateInfo *pVVar1;
  VkDynamicState *pVVar2;
  bool bVar3;
  allocator local_41;
  string local_40;
  
  pVVar1 = info->pDynamicState;
  bVar3 = true;
  if (pVVar1 != (VkPipelineDynamicStateCreateInfo *)0x0) {
    if (pVVar1->pNext == (void *)0x0) {
      pVVar1 = copy<VkPipelineDynamicStateCreateInfo>(this,pVVar1,1,alloc);
      info->pDynamicState = pVVar1;
      if (pVVar1 != (VkPipelineDynamicStateCreateInfo *)0x0) {
        pVVar2 = copy<VkDynamicState>
                           (this,pVVar1->pDynamicStates,(ulong)pVVar1->dynamicStateCount,alloc);
        info->pDynamicState->pDynamicStates = pVVar2;
      }
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_40,"pNext in VkPipelineDynamicStateCreateInfo not supported.",
                 &local_41);
      log_error_pnext_chain(&local_40,info->pDynamicState->pNext);
      std::__cxx11::string::_M_dispose();
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool StateRecorder::Impl::copy_dynamic_state(CreateInfo *info, ScratchAllocator &alloc,
                                             const DynamicStateInfo *)
{
	if (info->pDynamicState)
	{
		if (info->pDynamicState->pNext)
		{
			log_error_pnext_chain("pNext in VkPipelineDynamicStateCreateInfo not supported.",
								  info->pDynamicState->pNext);
			return false;
		}
		info->pDynamicState = copy(info->pDynamicState, 1, alloc);
	}

	if (info->pDynamicState)
	{
		const_cast<VkPipelineDynamicStateCreateInfo *>(info->pDynamicState)->pDynamicStates =
				copy(info->pDynamicState->pDynamicStates, info->pDynamicState->dynamicStateCount, alloc);
	}

	return true;
}